

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

ListBuilder * __thiscall
capnp::_::PointerBuilder::getList
          (ListBuilder *__return_storage_ptr__,PointerBuilder *this,ElementSize elementSize,
          word *defaultValue)

{
  word *defaultValue_local;
  ElementSize elementSize_local;
  PointerBuilder *this_local;
  
  WireHelpers::getWritableListPointer
            (__return_storage_ptr__,this->pointer,this->segment,this->capTable,elementSize,
             defaultValue);
  return __return_storage_ptr__;
}

Assistant:

ListBuilder PointerBuilder::getList(ElementSize elementSize, const word* defaultValue) {
  return WireHelpers::getWritableListPointer(pointer, segment, capTable, elementSize, defaultValue);
}